

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarLocation.cpp
# Opt level: O2

void __thiscall
license::locate::EnvironmentVarLocation::EnvironmentVarLocation(EnvironmentVarLocation *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"EnvironmentVarLocation",&local_31);
  LocatorStrategy::LocatorStrategy(&this->super_LocatorStrategy,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_LocatorStrategy)._vptr_LocatorStrategy =
       (_func_int **)&PTR_get_strategy_name_abi_cxx11__00569dc8;
  return;
}

Assistant:

EnvironmentVarLocation::EnvironmentVarLocation() : LocatorStrategy("EnvironmentVarLocation") {}